

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O2

sexp_conflict sexp_free_sizes(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_free_list_conflict psVar1;
  long lVar2;
  sexp_conflict psVar3;
  sexp_free_list_conflict *ppsVar4;
  ulong uVar5;
  ulong uVar6;
  sexp_heap psVar7;
  sexp_conflict tmp;
  sexp_conflict local_1048;
  sexp_gc_var_t local_1040;
  size_t freed;
  sexp_gc_var_t local_1028;
  sexp_uint_t sizes [512];
  
  psVar7 = (ctx->value).context.heap;
  tmp = (sexp_conflict)0x43e;
  sexp_gc(ctx,&freed);
  for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 1) {
    sizes[lVar2] = 0;
  }
  for (; psVar7 != (sexp_heap_conflict)0x0; psVar7 = psVar7->next) {
    ppsVar4 = &psVar7->free_list;
    while (psVar1 = *ppsVar4, psVar1 != (sexp_free_list_conflict)0x0) {
      uVar5 = psVar1->size + 0x1f;
      uVar6 = uVar5 >> 5;
      if (0x3fff < uVar5) {
        uVar6 = 0x1ff;
      }
      sizes[uVar6] = sizes[uVar6] + 1;
      ppsVar4 = &psVar1->next;
    }
  }
  local_1040.var = &local_1048;
  local_1028.next = &local_1040;
  local_1040.next = (ctx->value).context.saves;
  local_1028.var = &tmp;
  (ctx->value).context.saves = &local_1028;
  local_1048 = (sexp_conflict)0x23e;
  psVar3 = (sexp_conflict)0x23e;
  for (lVar2 = 0x1ff; -1 < lVar2; lVar2 = lVar2 + -1) {
    if (sizes[lVar2] != 0) {
      tmp = (sexp_conflict)sexp_cons_op(ctx,0,2,lVar2 * 2 + 1,sizes[lVar2] * 2 + 1);
      psVar3 = (sexp_conflict)sexp_cons_op(ctx,0,2,tmp,local_1048);
      local_1048 = psVar3;
    }
  }
  (ctx->value).context.saves = local_1040.next;
  return psVar3;
}

Assistant:

static sexp sexp_free_sizes (sexp ctx, sexp self, sexp_sint_t n) {
  size_t freed;
  sexp_uint_t sizes[512];
  sexp_sint_t i;
  sexp_heap h = sexp_context_heap(ctx);
  sexp_free_list q;
  sexp_gc_var2(res, tmp);

  /* run gc once to remove unused variables */
  sexp_gc(ctx, &freed);

  /* initialize stats */
  for (i=0; i<512; i++)
    sizes[i]=0;

  /* loop over each free block */
  for ( ; h; h=h->next)
    for (q=h->free_list; q; q=q->next)
      sizes[sexp_heap_chunks(q->size) > 511 ? 511 : sexp_heap_chunks(q->size)]++;

  /* build and return results */
  sexp_gc_preserve2(ctx, res, tmp);
  res = SEXP_NULL;
  for (i=511; i>=0; i--)
    if (sizes[i]) {
      tmp = sexp_cons(ctx, sexp_make_fixnum(i), sexp_make_fixnum(sizes[i]));
      res = sexp_cons(ctx, tmp, res);
    }
  sexp_gc_release2(ctx);
  return res;
}